

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t is_nfs4_flags_w(wchar_t *start,wchar_t *end,wchar_t *permset)

{
  wchar_t *pwVar1;
  wchar_t *local_30;
  wchar_t *p;
  wchar_t *permset_local;
  wchar_t *end_local;
  wchar_t *start_local;
  
  local_30 = start;
  while (local_30 < end) {
    pwVar1 = local_30 + 1;
    switch(*local_30) {
    case L'-':
      local_30 = pwVar1;
      break;
    default:
      return L'\0';
    case L'F':
      *permset = *permset | 0x40000000;
      local_30 = pwVar1;
      break;
    case L'I':
      *permset = *permset | 0x1000000;
      local_30 = pwVar1;
      break;
    case L'S':
      *permset = *permset | 0x20000000;
      local_30 = pwVar1;
      break;
    case L'd':
      *permset = *permset | 0x4000000;
      local_30 = pwVar1;
      break;
    case L'f':
      *permset = *permset | 0x2000000;
      local_30 = pwVar1;
      break;
    case L'i':
      *permset = *permset | 0x10000000;
      local_30 = pwVar1;
      break;
    case L'n':
      *permset = *permset | 0x8000000;
      local_30 = pwVar1;
    }
  }
  return L'\x01';
}

Assistant:

static int
is_nfs4_flags_w(const wchar_t *start, const wchar_t *end, int *permset)
{
	const wchar_t *p = start;

	while (p < end) {
		switch(*p++) {
		case L'f':
			*permset |= ARCHIVE_ENTRY_ACL_ENTRY_FILE_INHERIT;
			break;
		case L'd':
			*permset |= ARCHIVE_ENTRY_ACL_ENTRY_DIRECTORY_INHERIT;
			break;
		case L'i':
			*permset |= ARCHIVE_ENTRY_ACL_ENTRY_INHERIT_ONLY;
			break;
		case L'n':
			*permset |=
			    ARCHIVE_ENTRY_ACL_ENTRY_NO_PROPAGATE_INHERIT;
			break;
		case L'S':
			*permset |= ARCHIVE_ENTRY_ACL_ENTRY_SUCCESSFUL_ACCESS;
			break;
		case L'F':
			*permset |= ARCHIVE_ENTRY_ACL_ENTRY_FAILED_ACCESS;
			break;
		case L'I':
			*permset |= ARCHIVE_ENTRY_ACL_ENTRY_INHERITED;
			break;
		case L'-':
			break;
		default:
			return (0);
		}
	}
	return (1);
}